

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O1

ssize_t nghttp2_hd_deflate_hd_vec
                  (nghttp2_hd_deflater *deflater,nghttp2_vec *vec,size_t veclen,nghttp2_nv *nv,
                  size_t nvlen)

{
  int iVar1;
  size_t sVar2;
  nghttp2_bufs bufs;
  nghttp2_bufs nStack_68;
  
  iVar1 = nghttp2_bufs_wrap_init2(&nStack_68,vec,veclen,(deflater->ctx).mem);
  if (iVar1 == 0) {
    iVar1 = nghttp2_hd_deflate_hd_bufs(deflater,&nStack_68,nv,nvlen);
    sVar2 = nghttp2_bufs_len(&nStack_68);
    nghttp2_bufs_wrap_free(&nStack_68);
    if (iVar1 == -0x1f6) {
      sVar2 = 0xfffffffffffffdf3;
    }
    else if (iVar1 != 0) {
      sVar2 = (size_t)iVar1;
    }
  }
  else {
    sVar2 = (size_t)iVar1;
  }
  return sVar2;
}

Assistant:

ssize_t nghttp2_hd_deflate_hd_vec(nghttp2_hd_deflater *deflater,
                                  const nghttp2_vec *vec, size_t veclen,
                                  const nghttp2_nv *nv, size_t nvlen) {
  nghttp2_bufs bufs;
  int rv;
  nghttp2_mem *mem;
  size_t buflen;

  mem = deflater->ctx.mem;

  rv = nghttp2_bufs_wrap_init2(&bufs, vec, veclen, mem);

  if (rv != 0) {
    return rv;
  }

  rv = nghttp2_hd_deflate_hd_bufs(deflater, &bufs, nv, nvlen);

  buflen = nghttp2_bufs_len(&bufs);

  nghttp2_bufs_wrap_free(&bufs);

  if (rv == NGHTTP2_ERR_BUFFER_ERROR) {
    return NGHTTP2_ERR_INSUFF_BUFSIZE;
  }

  if (rv != 0) {
    return rv;
  }

  return (ssize_t)buflen;
}